

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O0

void __thiscall Node::OutputField(Node *this,ostream *os)

{
  ostream *poVar1;
  void *this_00;
  string local_108 [32];
  undefined1 local_e8 [32];
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  undefined1 local_88 [32];
  undefined1 local_68 [48];
  undefined1 local_38 [40];
  ostream *os_local;
  Node *this_local;
  
  local_38._32_8_ = os;
  os_local = (ostream *)this;
  if (this->Type == 0x108) {
    Indent_abi_cxx11_((Node *)local_38);
    poVar1 = std::operator<<(os,(string *)local_38);
    Expression_abi_cxx11_((Node *)local_68);
    poVar1 = std::operator<<(poVar1,(string *)local_68);
    poVar1 = std::operator<<(poVar1,".ReMap(FieldBase, ");
    Expression_abi_cxx11_((Node *)local_88);
    poVar1 = std::operator<<(poVar1,(string *)local_88);
    poVar1 = std::operator<<(poVar1,");");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    Indent_abi_cxx11_((Node *)local_a8);
    poVar1 = std::operator<<(poVar1,(string *)local_a8);
    poVar1 = std::operator<<(poVar1,"FieldBase += ");
    Expression_abi_cxx11_((Node *)local_c8);
    poVar1 = std::operator<<(poVar1,(string *)local_c8);
    poVar1 = std::operator<<(poVar1,";");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_c8);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string((string *)local_88);
    std::__cxx11::string::~string((string *)local_68);
    std::__cxx11::string::~string((string *)local_38);
  }
  else if (this->Type == 0x1f5) {
    OutputField(this->Tree[0],os);
    OutputField(this->Tree[1],(ostream *)local_38._32_8_);
  }
  else {
    poVar1 = std::operator<<(os,"// **** This shouldn\'t be possible ***** @ ");
    this_00 = (void *)std::ostream::operator<<(poVar1,this->lineno);
    poVar1 = (ostream *)std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    Indent_abi_cxx11_((Node *)local_e8);
    poVar1 = std::operator<<(poVar1,(string *)local_e8);
    genname(local_108);
    std::operator<<(poVar1,(string *)local_108);
    std::__cxx11::string::~string((string *)local_108);
    std::__cxx11::string::~string((string *)local_e8);
  }
  return;
}

Assistant:

void Node::OutputField(
	std::ostream& os	/**< iostream to write C++ code to */
)
{
	switch(Type)
	{
	case BAS_N_LIST:

		Tree[0]->OutputField(os);
		Tree[1]->OutputField(os);

		break;

	case BAS_S_AS:
		os << Indent() << Tree[1]->Expression() <<
			".ReMap(FieldBase, " << Tree[0]->Expression() <<
			");" << std::endl <<
			Indent() << "FieldBase += " << Tree[0]->Expression() << ";" << std::endl;
		break;

	default:
		os << "// **** This shouldn't be possible ***** @ " << lineno << std::endl <<
			Indent() << genname(TextValue);
		break;
	}
}